

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::printMemoryHeader(PrintSExpression *this,Memory *curr)

{
  ostream *poVar1;
  char local_2c [4];
  
  local_2c[3] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2c + 3,1);
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"memory",6);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  local_2c[2] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c + 2,1);
  poVar1 = Name::print((Name *)curr,this->o);
  local_2c[1] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c + 1,1);
  if ((curr->addressType).id == 3) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"i64 ",4);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  if ((curr->max).addr != 0xffffffffffffffff) {
    local_2c[0] = ' ';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->o,local_2c,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (curr->shared == true) {
    poVar1 = this->o;
    Colors::outputColorCode(poVar1,"\x1b[35m");
    Colors::outputColorCode(poVar1,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," shared",7);
    Colors::outputColorCode(poVar1,"\x1b[0m");
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o,")",1);
  return;
}

Assistant:

void PrintSExpression::printMemoryHeader(Memory* curr) {
  o << '(';
  printMedium(o, "memory") << ' ';
  curr->name.print(o) << ' ';
  if (curr->is64()) {
    o << "i64 ";
  }
  o << curr->initial;
  if (curr->hasMax()) {
    o << ' ' << curr->max;
  }
  if (curr->shared) {
    printMedium(o, " shared");
  }
  o << ")";
}